

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O0

void __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax*,psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax*>>
::acceptVisitor(CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax*,psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax*>>
                *this)

{
  SyntaxVisitor *in_RSI;
  
  CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
  ::acceptVisitor((CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
                   *)(this + -0x18),in_RSI);
  return;
}

Assistant:

virtual SyntaxVisitor::Action acceptVisitor(SyntaxVisitor* visitor) override
    {
        for (auto it = this; it; it = it->next) {
            SyntaxNodeT node = static_cast<SyntaxNodeT>(it->value);
            if (node) {
                auto action = node->acceptVisitor(visitor);
                if (action == SyntaxVisitor::Action::Quit)
                    return action;
            }
        }
        return SyntaxVisitor::Action::Visit;
    }